

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O3

void __thiscall
cppjit::kernel<bool,_cppjit::detail::pack<int,_double>_>::kernel
          (kernel<bool,_cppjit::detail::pack<int,_double>_> *this,string *kernel_name)

{
  pointer pcVar1;
  undefined1 local_29;
  gcc *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  (this->kernel_name)._M_dataplus._M_p = (pointer)&(this->kernel_name).field_2;
  pcVar1 = (kernel_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + kernel_name->_M_string_length);
  local_28 = (gcc *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppjit::builder::gcc,std::allocator<cppjit::builder::gcc>,std::__cxx11::string_const&>
            (&_Stack_20,&local_28,(allocator<cppjit::builder::gcc> *)&local_29,kernel_name);
  (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_28->super_builder;
  (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_20._M_pi;
  this->kernel_implementation = (function<bool_(int,_double)>)(ZEXT832(0) << 0x20);
  this->verbose = false;
  return;
}

Assistant:

kernel(const std::string &kernel_name)
      : kernel_name(kernel_name),
        builder(std::make_shared<cppjit::builder::gcc>(kernel_name)),
        verbose(false) {}